

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::Generate
          (EnumLiteGenerator *this,Printer *printer)

{
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *prVar1;
  string *psVar2;
  char cVar3;
  Context *pCVar4;
  pointer pcVar5;
  ushort *puVar6;
  Printer *pPVar7;
  long *plVar8;
  string *psVar9;
  EnumValueDescriptor *pEVar10;
  pointer ppEVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  bool bVar13;
  Nonnull<char_*> pcVar14;
  Nonnull<const_char_*> pcVar15;
  Options *options;
  anon_union_8_1_a8a14541_for_iterator_2 options_00;
  char *pcVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  _Alloc_hider _Var20;
  EnumDescriptor *pEVar21;
  pointer ppEVar22;
  long lVar23;
  string_view text;
  string_view begin_varname;
  string_view text_00;
  string_view begin_varname_00;
  string_view text_01;
  string_view begin_varname_01;
  string_view text_02;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars_1;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  anon_union_8_1_a8a14541_for_iterator_2 local_208;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_200;
  undefined1 local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  anon_union_8_1_a8a14541_for_iterator_2 local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [40];
  string local_180 [16];
  EnumValueOptions *local_170 [2];
  long *local_160 [2];
  long local_150 [2];
  undefined2 local_140;
  undefined1 local_138 [8];
  long *local_130;
  long local_120 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  long local_100 [2];
  undefined2 local_f0;
  undefined1 local_e8 [8];
  long *local_e0;
  long local_d0 [2];
  long *local_c0 [2];
  long local_b0 [2];
  undefined2 local_a0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_98;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  pEVar21 = this->descriptor_;
  pCVar4 = this->context_;
  local_80[4] = (pCVar4->options_).opensource_runtime;
  local_80[5] = (pCVar4->options_).annotate_code;
  local_80[0] = (pCVar4->options_).generate_immutable_code;
  local_80[1] = (pCVar4->options_).generate_mutable_code;
  local_80[2] = (pCVar4->options_).generate_shared_code;
  local_80[3] = (pCVar4->options_).enforce_lite;
  pcVar5 = (pCVar4->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_80 + 8),pcVar5,
             pcVar5 + (pCVar4->options_).annotation_list_file._M_string_length);
  pcVar5 = (pCVar4->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar5,
             pcVar5 + (pCVar4->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar4->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar4->options_).jvm_dsl;
  WriteEnumDocComment(printer,pEVar21,(Options *)local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  pCVar4 = this->context_;
  pEVar21 = this->descriptor_;
  bVar13 = this->immutable_api_;
  local_208.slot_ = (slot_type *)local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (pCVar4,printer,pEVar21,bVar13,(string *)&local_208);
  if (local_208.slot_ != (slot_type *)local_1f8) {
    operator_delete(local_208.slot_,local_1f8._0_8_ + 1);
  }
  puVar6 = (ushort *)(this->descriptor_->all_names_).payload_;
  local_208._2_6_ = 0;
  local_208._0_2_ = *puVar6;
  aStack_200.slot_ = (slot_type *)((long)puVar6 + ~(ulong)local_208.slot_);
  local_1d8._M_dataplus._M_p = "";
  if ((this->descriptor_->options_->field_0)._impl_.deprecated_ != false) {
    local_1d8._M_dataplus._M_p = "@java.lang.Deprecated ";
  }
  text._M_str = 
  "$deprecation$public enum $classname$\n    implements com.google.protobuf.Internal.EnumLite {\n";
  text._M_len = 0x5c;
  io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[12],char_const*>
            (printer,text,(char (*) [10])0x5620ff,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_208,(char (*) [12])0x64d889,
             (char **)(local_1f8 + 0x20));
  begin_varname._M_str = "classname";
  begin_varname._M_len = 9;
  end_varname._M_str = "classname";
  end_varname._M_len = 9;
  options = (Options *)0x9;
  io::Printer::Annotate<google::protobuf::EnumDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  _Var20._M_p = (pointer)(this->canonical_values_).
                         super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._16_8_ =
       (this->canonical_values_).
       super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var20._M_p != (pointer)local_1a8._16_8_) {
    prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_1f8 + 0x20);
    do {
      pPVar7 = *(Printer **)_Var20._M_p;
      local_1d8._M_dataplus._M_p = (pointer)0x0;
      local_1d8._M_string_length = 0;
      local_1d8.field_2._M_allocated_capacity =
           (long)absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
      plVar8 = (long *)(pPVar7->sink_).buffer_;
      lVar19 = *plVar8;
      local_208.slot_ = (slot_type *)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,lVar19,plVar8[1] + lVar19);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,prVar1,(char (*) [5])0x7203be);
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),(string *)&local_208);
      if (local_208.slot_ != (slot_type *)local_1f8) {
        operator_delete(local_208.slot_,local_1f8._0_8_ + 1);
      }
      pcVar14 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&(pPVar7->sink_).stream_ + 4),
                           (Nonnull<char_*>)local_1f8);
      local_208.slot_ = (slot_type *)(pcVar14 + -(long)local_1f8);
      options_00.slot_ = (slot_type *)local_1a8;
      aStack_200.slot_ = (slot_type *)local_1f8;
      local_1b8.slot_ = options_00.slot_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,(slot_type *)local_1f8,pcVar14);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[7]>(&local_98,prVar1,(char (*) [7])0x6e9ba7);
      std::__cxx11::string::operator=
                ((string *)((long)local_98.first.field_1.slot_ + 0x10),(string *)&local_1b8);
      if (local_1b8.slot_ != (slot_type *)local_1a8) {
        operator_delete(local_1b8.slot_,local_1a8._0_8_ + 1);
      }
      pCVar4 = this->context_;
      local_e8[4] = (pCVar4->options_).opensource_runtime;
      local_e8[5] = (pCVar4->options_).annotate_code;
      local_e8[0] = (pCVar4->options_).generate_immutable_code;
      local_e8[1] = (pCVar4->options_).generate_mutable_code;
      local_e8[2] = (pCVar4->options_).generate_shared_code;
      local_e8[3] = (pCVar4->options_).enforce_lite;
      local_e0 = local_d0;
      pcVar5 = (pCVar4->options_).annotation_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar5,
                 pcVar5 + (pCVar4->options_).annotation_list_file._M_string_length);
      local_c0[0] = local_b0;
      pcVar5 = (pCVar4->options_).output_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_d0 + 2),pcVar5,
                 pcVar5 + (pCVar4->options_).output_list_file._M_string_length);
      local_a0._0_1_ = (pCVar4->options_).strip_nonfunctional_codegen;
      local_a0._1_1_ = (pCVar4->options_).jvm_dsl;
      WriteEnumValueDocComment
                ((java *)printer,pPVar7,(EnumValueDescriptor *)(local_100 + 3),
                 (Options *)options_00.slot_);
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      if (*(char *)((pPVar7->sink_).bytes_written_ + 0x58) == '\x01') {
        text_00._M_str = "@java.lang.Deprecated\n";
        text_00._M_len = 0x16;
        io::Printer::Print<>(printer,text_00);
      }
      text_19._M_str = "$name$($number$),\n";
      text_19._M_len = 0x12;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)prVar1,text_19);
      begin_varname_00._M_str = "name";
      begin_varname_00._M_len = 4;
      end_varname_00._M_str = "name";
      end_varname_00._M_len = 4;
      options = (Options *)0x4;
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (printer,begin_varname_00,end_varname_00,(EnumValueDescriptor *)pPVar7,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set(prVar1);
      _Var20._M_p = _Var20._M_p + 8;
    } while (_Var20._M_p != (pointer)local_1a8._16_8_);
  }
  bVar13 = EnumDescriptor::is_closed(this->descriptor_);
  if (!bVar13) {
    text_01._M_str = "${$UNRECOGNIZED$}$(-1),\n";
    text_01._M_len = 0x18;
    io::Printer::Print<char[2],char[1],char[2],char[1]>
              (printer,text_01,(char (*) [2])0x5752de,(char (*) [1])0x50989c,(char (*) [2])0x64e2bd,
               (char (*) [1])0x50989c);
    begin_varname_01._M_str = "{";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "}";
    end_varname_01._M_len = 1;
    options = (Options *)0x1;
    io::Printer::Annotate<google::protobuf::EnumDescriptor>
              (printer,begin_varname_01,end_varname_01,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  }
  text_02._M_str = ";\n\n";
  text_02._M_len = 3;
  io::Printer::Print<>(printer,text_02);
  _Var20._M_p = (pointer)(this->aliases_).
                         super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._16_8_ =
       (this->aliases_).
       super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var20._M_p != (pointer)local_1a8._16_8_) {
    paVar12 = &local_1d8.field_2;
    local_1a8._24_8_ = 0x716e90;
    psVar2 = (string *)(local_1f8 + 0x20);
    do {
      local_208.slot_ = (slot_type *)0x0;
      aStack_200.slot_ = (slot_type *)0x0;
      local_1f8._0_8_ = local_1a8._24_8_;
      puVar6 = (ushort *)(this->descriptor_->all_names_).payload_;
      local_1d8._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar2,(long)puVar6 + ~(ulong)*puVar6,(long)puVar6 + -1);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[10]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,&local_208,(char (*) [10])0x5620ff);
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),psVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar12) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
      }
      psVar9 = ((pointer)_Var20._M_p)->value->all_names_;
      pcVar5 = (psVar9->_M_dataplus)._M_p;
      local_1d8._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar2,pcVar5,pcVar5 + psVar9->_M_string_length);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,&local_208,(char (*) [5])0x7203be);
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),psVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar12) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
      }
      psVar9 = ((pointer)_Var20._M_p)->canonical_value->all_names_;
      pcVar5 = (psVar9->_M_dataplus)._M_p;
      local_1d8._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar2,pcVar5,pcVar5 + psVar9->_M_string_length);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[15]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,&local_208,(char (*) [15])"canonical_name");
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),psVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar12) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
      }
      pPVar7 = (Printer *)((pointer)_Var20._M_p)->value;
      pCVar4 = this->context_;
      local_138[4] = (pCVar4->options_).opensource_runtime;
      local_138[5] = (pCVar4->options_).annotate_code;
      local_138[0] = (pCVar4->options_).generate_immutable_code;
      local_138[1] = (pCVar4->options_).generate_mutable_code;
      local_138[2] = (pCVar4->options_).generate_shared_code;
      local_138[3] = (pCVar4->options_).enforce_lite;
      local_130 = local_120;
      pcVar5 = (pCVar4->options_).annotation_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar5,
                 pcVar5 + (pCVar4->options_).annotation_list_file._M_string_length);
      local_110._M_allocated_capacity = (size_type)local_100;
      pcVar5 = (pCVar4->options_).output_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar5,
                 pcVar5 + (pCVar4->options_).output_list_file._M_string_length);
      local_f0._0_1_ = (pCVar4->options_).strip_nonfunctional_codegen;
      local_f0._1_1_ = (pCVar4->options_).jvm_dsl;
      WriteEnumValueDocComment
                ((java *)printer,pPVar7,(EnumValueDescriptor *)(local_150 + 3),options);
      if ((long *)local_110._M_allocated_capacity != local_100) {
        operator_delete((void *)local_110._M_allocated_capacity,local_100[0] + 1);
      }
      if (local_130 != local_120) {
        operator_delete(local_130,local_120[0] + 1);
      }
      text_20._M_str = "public static final $classname$ $name$ = $canonical_name$;\n";
      text_20._M_len = 0x3b;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_208,text_20);
      begin_varname_02._M_str = "name";
      begin_varname_02._M_len = 4;
      end_varname_02._M_str = "name";
      end_varname_02._M_len = 4;
      options = (Options *)0x4;
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (printer,begin_varname_02,end_varname_02,((pointer)_Var20._M_p)->value,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_208);
      _Var20._M_p = _Var20._M_p + 0x10;
    } while (_Var20._M_p != (pointer)local_1a8._16_8_);
  }
  pEVar21 = this->descriptor_;
  if (0 < pEVar21->value_count_) {
    lVar23 = 0;
    local_1a8._16_8_ = (long)absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    prVar1 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_1f8 + 0x20);
    lVar19 = 0;
    do {
      local_1d8._M_dataplus._M_p = (pointer)0x0;
      local_1d8._M_string_length = 0;
      local_1d8.field_2._M_allocated_capacity = local_1a8._16_8_;
      if (lVar19 < pEVar21->value_count_) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,(long)pEVar21->value_count_,"index < value_count()");
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1b8);
      }
      plVar8 = *(long **)((long)&pEVar21->values_->all_names_ + lVar23);
      lVar17 = *plVar8;
      local_208.slot_ = (slot_type *)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,lVar17,plVar8[1] + lVar17);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1b8,prVar1,(char (*) [5])0x7203be);
      std::__cxx11::string::operator=((string *)(local_1b0 + 0x10),(string *)&local_208);
      if (local_208.slot_ != (slot_type *)local_1f8) {
        operator_delete(local_208.slot_,local_1f8._0_8_ + 1);
      }
      pEVar21 = this->descriptor_;
      lVar17 = (long)pEVar21->value_count_;
      if (lVar19 < lVar17) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,lVar17,"index < value_count()");
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_98);
      }
      pcVar14 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&pEVar21->values_->number_ + lVar23),
                           (Nonnull<char_*>)local_1f8);
      local_208.slot_ = (slot_type *)(pcVar14 + -(long)local_1f8);
      local_1b8.slot_ = (slot_type *)local_1a8;
      aStack_200.slot_ = (slot_type *)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,(slot_type *)local_1f8,pcVar14);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[7]>(&local_98,prVar1,(char (*) [7])0x6e9ba7);
      std::__cxx11::string::operator=
                ((string *)((long)local_98.first.field_1.slot_ + 0x10),(string *)&local_1b8);
      if (local_1b8.slot_ != (slot_type *)local_1a8) {
        operator_delete(local_1b8.slot_,local_1a8._0_8_ + 1);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[2]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_208,prVar1,(char (*) [2])0x5752de);
      std::__cxx11::string::_M_replace
                ((ulong)((long)aStack_200.slot_ + 0x10),0,*(char **)((long)aStack_200.slot_ + 0x18),
                 0x50989c);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[2]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_208,prVar1,(char (*) [2])0x64e2bd);
      std::__cxx11::string::_M_replace
                ((ulong)((long)aStack_200.slot_ + 0x10),0,*(char **)((long)aStack_200.slot_ + 0x18),
                 0x50989c);
      pEVar21 = this->descriptor_;
      lVar17 = (long)pEVar21->value_count_;
      if (lVar19 < lVar17) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,lVar17,"index < value_count()");
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_208,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
LAB_0033d57f:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_208);
      }
      cVar3 = *(char *)(*(long *)((long)&pEVar21->values_->options_ + lVar23) + 0x58);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[12]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_208,prVar1,(char (*) [12])0x64d889);
      pcVar16 = "";
      if (cVar3 != '\0') {
        pcVar16 = "@java.lang.Deprecated ";
      }
      std::__cxx11::string::_M_replace
                ((ulong)((long)aStack_200.slot_ + 0x10),0,*(char **)((long)aStack_200.slot_ + 0x18),
                 (ulong)pcVar16);
      pEVar21 = this->descriptor_;
      lVar17 = (long)pEVar21->value_count_;
      if (lVar19 < lVar17) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,lVar17,"index < value_count()");
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_208,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
        goto LAB_0033d57f;
      }
      pEVar10 = pEVar21->values_;
      pCVar4 = this->context_;
      local_1a8[0x24] = (pCVar4->options_).opensource_runtime;
      local_1a8[0x25] = (pCVar4->options_).annotate_code;
      local_1a8[0x20] = (pCVar4->options_).generate_immutable_code;
      local_1a8[0x21] = (pCVar4->options_).generate_mutable_code;
      local_1a8[0x22] = (pCVar4->options_).generate_shared_code;
      local_1a8[0x23] = (pCVar4->options_).enforce_lite;
      local_180._0_8_ = local_170;
      pcVar5 = (pCVar4->options_).annotation_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                (local_180,pcVar5,pcVar5 + (pCVar4->options_).annotation_list_file._M_string_length)
      ;
      local_160[0] = local_150;
      pcVar5 = (pCVar4->options_).output_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_160,pcVar5,
                 pcVar5 + (pCVar4->options_).output_list_file._M_string_length);
      local_140._0_1_ = (pCVar4->options_).strip_nonfunctional_codegen;
      local_140._1_1_ = (pCVar4->options_).jvm_dsl;
      WriteEnumValueDocComment
                ((java *)printer,(Printer *)(&pEVar10->super_SymbolBaseN<0> + lVar23),
                 (EnumValueDescriptor *)(local_1a8 + 0x20),(Options *)pcVar16);
      if (local_160[0] != local_150) {
        operator_delete(local_160[0],local_150[0] + 1);
      }
      if ((EnumValueOptions **)local_180._0_8_ != local_170) {
        operator_delete((void *)local_180._0_8_,
                        (ulong)((long)&(local_170[0]->super_Message).super_MessageLite.
                                       _vptr_MessageLite + 1));
      }
      text_21._M_str = "$deprecation$public static final int ${$$name$_VALUE$}$ = $number$;\n";
      text_21._M_len = 0x44;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)prVar1,text_21);
      pEVar21 = this->descriptor_;
      lVar17 = (long)pEVar21->value_count_;
      if (lVar19 < lVar17) {
        pcVar15 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar15 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar19,lVar17,"index < value_count()");
      }
      if (pcVar15 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_208,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar15);
        goto LAB_0033d57f;
      }
      begin_varname_03._M_str = "{";
      begin_varname_03._M_len = 1;
      end_varname_03._M_str = "}";
      end_varname_03._M_len = 1;
      io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
                (printer,begin_varname_03,end_varname_03,
                 (EnumValueDescriptor *)(&pEVar21->values_->super_SymbolBaseN<0> + lVar23),
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set(prVar1);
      lVar19 = lVar19 + 1;
      pEVar21 = this->descriptor_;
      lVar23 = lVar23 + 0x30;
    } while (lVar19 < pEVar21->value_count_);
  }
  text_03._M_str = "\n";
  text_03._M_len = 1;
  io::Printer::Print<>(printer,text_03);
  text_04._M_str = "\n@java.lang.Override\npublic final int getNumber() {\n";
  text_04._M_len = 0x34;
  io::Printer::Print<>(printer,text_04);
  bVar13 = EnumDescriptor::is_closed(this->descriptor_);
  if (!bVar13) {
    text_05._M_str =
         "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
    ;
    text_05._M_len = 0x8f;
    io::Printer::Print<>(printer,text_05);
  }
  text_06._M_str = "  return value;\n}\n\n";
  text_06._M_len = 0x13;
  io::Printer::Print<>(printer,text_06);
  if ((this->context_->options_).opensource_runtime == true) {
    puVar6 = (ushort *)(this->descriptor_->all_names_).payload_;
    local_208._2_6_ = 0;
    local_208._0_2_ = *puVar6;
    aStack_200.slot_ = (slot_type *)((long)puVar6 + ~(ulong)local_208.slot_);
    text_07._M_str =
         "/**\n * @param value The number of the enum to look for.\n * @return The enum associated with the given number.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\n"
    ;
    text_07._M_len = 0x109;
    io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
              (printer,text_07,(char (*) [10])0x5620ff,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_208);
  }
  if ((this->context_->options_).opensource_runtime == false) {
    text_08._M_str = "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n";
    text_08._M_len = 0x37;
    io::Printer::Print<>(printer,text_08);
  }
  puVar6 = (ushort *)(this->descriptor_->all_names_).payload_;
  local_208._2_6_ = 0;
  local_208._0_2_ = *puVar6;
  aStack_200.slot_ = (slot_type *)((long)puVar6 + ~(ulong)local_208.slot_);
  text_09._M_str = "public static $classname$ forNumber(int value) {\n  switch (value) {\n";
  text_09._M_len = 0x44;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_09,(char (*) [10])0x5620ff,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_208);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  ppEVar22 = (this->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar11 = (this->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar22 != ppEVar11) {
    do {
      psVar9 = (*ppEVar22)->all_names_;
      local_1b0 = (psVar9->_M_dataplus)._M_p;
      local_1b8 = (anon_union_8_1_a8a14541_for_iterator_2)psVar9->_M_string_length;
      pcVar14 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          ((*ppEVar22)->number_,local_1f8);
      local_208.slot_ = (slot_type *)(pcVar14 + -(long)local_1f8);
      aStack_200 = (anon_union_8_1_a8a14541_for_iterator_2)local_1f8;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1f8 + 0x20),local_1f8,pcVar14);
      text_10._M_str = "case $number$: return $name$;\n";
      text_10._M_len = 0x1e;
      io::Printer::
      Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[7],std::__cxx11::string>
                (printer,text_10,(char (*) [5])0x7203be,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_1b8,
                 (char (*) [7])0x6e9ba7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1f8 + 0x20));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
      }
      ppEVar22 = ppEVar22 + 1;
    } while (ppEVar22 != ppEVar11);
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  puVar6 = (ushort *)(this->descriptor_->all_names_).payload_;
  local_208._2_6_ = 0;
  local_208._0_2_ = *puVar6;
  aStack_200.slot_ = (slot_type *)((long)puVar6 + ~(ulong)local_208.slot_);
  text_11._M_str =
       "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        @java.lang.Override\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\npublic static com.google.protobuf.Internal.EnumVerifier \n    internalGetVerifier() {\n  return $classname$Verifier.INSTANCE;\n}\n\nprivate static final class $classname$Verifier implements \n     com.google.protobuf.Internal.EnumVerifier { \n        static final com.google.protobuf.Internal.EnumVerifier\n            INSTANCE = new $classname$Verifier();\n        @java.lang.Override\n        public boolean isInRange(int number) {\n          return $classname$.forNumber(number) != null;\n        }\n      };\n\n"
  ;
  text_11._M_len = 0x3d4;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_11,(char (*) [10])0x5620ff,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_208);
  if ((this->context_->options_).opensource_runtime == false) {
    text_12._M_str =
         "/**\n * Override of toString that prints the number and name.\n * This is primarily intended as a developer aid.\n *\n * <p>NOTE: This implementation is liable to change in the future,\n * and should not be relied on in code.\n */\n@java.lang.Override\npublic java.lang.String toString() {\n  StringBuilder result = new StringBuilder(\"<\");\n  result.append(getClass().getName()).append(\'@\')\n      .append(java.lang.Integer.toHexString(\n        java.lang.System.identityHashCode(this)));\n"
    ;
    text_12._M_len = 0x1dd;
    io::Printer::Print<>(printer,text_12);
    bVar13 = EnumDescriptor::is_closed(this->descriptor_);
    if (bVar13) {
      pcVar16 = "  result.append(\" number=\").append(getNumber());\n";
      sVar18 = 0x31;
    }
    else {
      pcVar16 = 
      "  if (this != UNRECOGNIZED) {\n    result.append(\" number=\").append(getNumber());\n  }\n";
      sVar18 = 0x55;
    }
    text_13._M_str = pcVar16;
    text_13._M_len = sVar18;
    io::Printer::Print<>(printer,text_13);
    text_14._M_str =
         "  return result.append(\" name=\")\n      .append(name()).append(\'>\').toString();\n}\n\n"
    ;
    text_14._M_len = 0x52;
    io::Printer::Print<>(printer,text_14);
  }
  puVar6 = (ushort *)(this->descriptor_->all_names_).payload_;
  local_208._2_6_ = 0;
  local_208._0_2_ = *puVar6;
  aStack_200.slot_ = (slot_type *)((long)puVar6 + ~(ulong)local_208.slot_);
  text_15._M_str = "private final int value;\n\nprivate $classname$(int value) {\n";
  text_15._M_len = 0x3b;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_15,(char (*) [10])0x5620ff,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_208);
  text_16._M_str = "  this.value = value;\n}\n";
  text_16._M_len = 0x18;
  io::Printer::Print<>(printer,text_16);
  pcVar16 = (this->descriptor_->all_names_).payload_;
  local_208._2_6_ = 0;
  local_208._0_2_ = *(ushort *)(pcVar16 + 2);
  aStack_200.slot_ = (slot_type *)(pcVar16 + ~(ulong)local_208.slot_);
  text_17._M_str = "\n// @@protoc_insertion_point(enum_scope:$full_name$)\n";
  text_17._M_len = 0x35;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_17,(char (*) [10])0x6a5b99,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_208);
  io::Printer::Outdent(printer);
  text_18._M_str = "}\n\n";
  text_18._M_len = 3;
  io::Printer::Print<>(printer,text_18);
  return;
}

Assistant:

void EnumLiteGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);


  printer->Print(
      "$deprecation$public enum $classname$\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n",
      "classname", descriptor_->name(), "deprecation",
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "");
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  for (const EnumValueDescriptor* value : canonical_values_) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["name"] = std::string(value->name());
    vars["number"] = absl::StrCat(value->number());
    WriteEnumValueDocComment(printer, value, context_->options());
    if (value->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    printer->Print(vars, "$name$($number$),\n");
    printer->Annotate("name", value);
  }

  if (!descriptor_->is_closed()) {
    printer->Print("${$UNRECOGNIZED$}$(-1),\n", "{", "", "}", "");
    printer->Annotate("{", "}", descriptor_);
  }

  printer->Print(
      ";\n"
      "\n");

  // -----------------------------------------------------------------

  for (const Alias& alias : aliases_) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["classname"] = std::string(descriptor_->name());
    vars["name"] = std::string(alias.value->name());
    vars["canonical_name"] = std::string(alias.canonical_value->name());
    WriteEnumValueDocComment(printer, alias.value, context_->options());
    printer->Print(
        vars, "public static final $classname$ $name$ = $canonical_name$;\n");
    printer->Annotate("name", alias.value);
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    absl::flat_hash_map<absl::string_view, std::string> vars;
    vars["name"] = std::string(descriptor_->value(i)->name());
    vars["number"] = absl::StrCat(descriptor_->value(i)->number());
    vars["{"] = "";
    vars["}"] = "";
    vars["deprecation"] = descriptor_->value(i)->options().deprecated()
                              ? "@java.lang.Deprecated "
                              : "";
    WriteEnumValueDocComment(printer, descriptor_->value(i),
                             context_->options());
    printer->Print(vars,
                   "$deprecation$public static final int ${$$name$_VALUE$}$ = "
                   "$number$;\n");
    printer->Annotate("{", "}", descriptor_->value(i));
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
      "\n"
      "@java.lang.Override\n"
      "public final int getNumber() {\n");
  if (!descriptor_->is_closed()) {
    printer->Print(
        "  if (this == UNRECOGNIZED) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
  }
  printer->Print(
      "  return value;\n"
      "}\n"
      "\n");
  if (context_->options().opensource_runtime) {
    printer->Print(
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $classname$ valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n",
        "classname", descriptor_->name());
  }

  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
  }
  printer->Print(
      "public static $classname$ forNumber(int value) {\n"
      "  switch (value) {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (const EnumValueDescriptor* value : canonical_values_) {
    printer->Print("case $number$: return $name$;\n", "name", value->name(),
                   "number", absl::StrCat(value->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "\n"
      "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
      "    internalGetValueMap() {\n"
      "  return internalValueMap;\n"
      "}\n"
      "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
      "    $classname$> internalValueMap =\n"
      "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
      "        @java.lang.Override\n"
      "        public $classname$ findValueByNumber(int number) {\n"
      "          return $classname$.forNumber(number);\n"
      "        }\n"
      "      };\n"
      "\n"
      "public static com.google.protobuf.Internal.EnumVerifier \n"
      "    internalGetVerifier() {\n"
      "  return $classname$Verifier.INSTANCE;\n"
      "}\n"
      "\n"
      "private static final class $classname$Verifier implements \n"
      "     com.google.protobuf.Internal.EnumVerifier { \n"
      "        static final com.google.protobuf.Internal.EnumVerifier\n"
      "            INSTANCE = new $classname$Verifier();\n"
      "        @java.lang.Override\n"
      "        public boolean isInRange(int number) {\n"
      "          return $classname$.forNumber(number) != null;\n"
      "        }\n"
      "      };\n"
      "\n",
      "classname", descriptor_->name());
  if (!context_->options().opensource_runtime) {
    printer->Print(
        "/**\n"
        " * Override of toString that prints the number and name.\n"
        " * This is primarily intended as a developer aid.\n"
        " *\n"
        " * <p>NOTE: This implementation is liable to change in the future,\n"
        " * and should not be relied on in code.\n"
        " */\n"
        "@java.lang.Override\n"
        "public java.lang.String toString() {\n"
        "  StringBuilder result = new StringBuilder(\"<\");\n"
        "  result.append(getClass().getName()).append('@')\n"
        "      .append(java.lang.Integer.toHexString(\n"
        "        java.lang.System.identityHashCode(this)));\n");
    if (!descriptor_->is_closed()) {
      printer->Print(
          "  if (this != UNRECOGNIZED) {\n"
          "    result.append(\" number=\").append(getNumber());\n"
          "  }\n");
    } else {
      printer->Print("  result.append(\" number=\").append(getNumber());\n");
    }
    printer->Print(
        "  return result.append(\" name=\")\n"
        "      .append(name()).append('>').toString();\n"
        "}\n"
        "\n");
  }

  printer->Print(
      "private final int value;\n\n"
      "private $classname$(int value) {\n",
      "classname", descriptor_->name());
  printer->Print(
      "  this.value = value;\n"
      "}\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}